

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

void __thiscall QGraphicsLayoutItem::setGeometry(QGraphicsLayoutItem *this,QRectF *rect)

{
  QGraphicsLayoutItemPrivate *this_00;
  QSizeF *in_RSI;
  QSizeF *in_RDI;
  long in_FS_OFFSET;
  QSizeF QVar1;
  QGraphicsLayoutItemPrivate *d;
  QSizeF effectiveSize;
  QRectF *in_stack_ffffffffffffff38;
  QRectF *this_01;
  QSizeF *pQVar2;
  SizeHint which;
  QGraphicsLayoutItem *in_stack_ffffffffffffff58;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QRectF local_78;
  QSizeF local_58;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal qStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  this_00 = d_func((QGraphicsLayoutItem *)0x9b57a5);
  which = (SizeHint)((ulong)pQVar2 >> 0x20);
  local_18 = -NAN;
  qStack_10 = -NAN;
  QVar1 = QRectF::size(in_stack_ffffffffffffff38);
  local_38 = QVar1.wd;
  local_30 = QVar1.ht;
  QSizeF::QSizeF(&local_58);
  QVar1 = effectiveSizeHint(in_stack_ffffffffffffff58,which,in_RSI);
  local_48 = QVar1.wd;
  local_40 = QVar1.ht;
  QVar1 = QSizeF::expandedTo(in_RSI,(QSizeF *)this_00);
  local_28 = QVar1.wd;
  local_20 = QVar1.ht;
  this_01 = &local_78;
  QSizeF::QSizeF((QSizeF *)this_01);
  QVar1 = effectiveSizeHint(in_stack_ffffffffffffff58,which,in_RSI);
  local_78.w = QVar1.wd;
  local_78.h = QVar1.ht;
  QVar1 = QSizeF::boundedTo(in_RSI,(QSizeF *)this_00);
  local_18 = QVar1.wd;
  qStack_10 = QVar1.ht;
  QRectF::topLeft(this_01);
  QRectF::QRectF((QRectF *)this_00,(QPointF *)this_01,in_RDI);
  *(undefined4 *)&(this_00->geom).w = local_88;
  *(undefined4 *)((long)&(this_00->geom).w + 4) = uStack_84;
  *(undefined4 *)&(this_00->geom).h = uStack_80;
  *(undefined4 *)((long)&(this_00->geom).h + 4) = uStack_7c;
  *(undefined4 *)&(this_00->geom).xp = local_98;
  *(undefined4 *)((long)&(this_00->geom).xp + 4) = uStack_94;
  *(undefined4 *)&(this_00->geom).yp = uStack_90;
  *(undefined4 *)((long)&(this_00->geom).yp + 4) = uStack_8c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsLayoutItem::setGeometry(const QRectF &rect)
{
    Q_D(QGraphicsLayoutItem);
    QSizeF effectiveSize = rect.size().expandedTo(effectiveSizeHint(Qt::MinimumSize))
                                .boundedTo(effectiveSizeHint(Qt::MaximumSize));
    d->geom = QRectF(rect.topLeft(), effectiveSize);
}